

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O0

vector<common_sampler_type,_std::allocator<common_sampler_type>_> *
common_sampler_types_from_chars(string *chars)

{
  initializer_list<std::pair<const_char,_common_sampler_type>_> __l;
  bool bVar1;
  _Node_iterator_base<std::pair<const_char,_common_sampler_type>,_false> __x;
  undefined8 in_RSI;
  hasher *in_RDI;
  iterator sampler;
  char *c;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  unordered_map<char,_common_sampler_type,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_common_sampler_type>_>_>
  sampler_name_map;
  vector<common_sampler_type,_std::allocator<common_sampler_type>_> *samplers;
  unordered_map<char,_common_sampler_type,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_common_sampler_type>_>_>
  *this;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe60;
  key_equal *in_stack_fffffffffffffe68;
  hasher *__n;
  pair<const_char,_common_sampler_type> *this_00;
  pair<const_char,_common_sampler_type> *this_01;
  pair<const_char,_common_sampler_type> *this_02;
  pair<const_char,_common_sampler_type> *this_03;
  _Node_iterator_base<std::pair<const_char,_common_sampler_type>,_false> local_130;
  _Node_iterator_base<std::pair<const_char,_common_sampler_type>,_false> local_128;
  reference local_120;
  undefined8 local_118;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  undefined8 local_108;
  undefined1 local_fd;
  unordered_map<char,_common_sampler_type,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_common_sampler_type>_>_>
  local_eb;
  char local_b1;
  common_sampler_type local_b0;
  char local_a9;
  common_sampler_type local_a8;
  char local_a1;
  pair<const_char,_common_sampler_type> local_a0;
  pair<const_char,_common_sampler_type> local_98;
  pair<const_char,_common_sampler_type> local_90;
  pair<const_char,_common_sampler_type> local_88;
  pair<const_char,_common_sampler_type> local_80;
  pair<const_char,_common_sampler_type> local_78;
  pair<const_char,_common_sampler_type> local_70;
  pair<const_char,_common_sampler_type> local_68;
  pair<const_char,_common_sampler_type> local_60;
  pair<const_char,_common_sampler_type> *local_58;
  undefined8 local_50;
  undefined8 local_10;
  
  __n = in_RDI;
  local_10 = in_RSI;
  local_a1 = common_sampler_type_to_chr(COMMON_SAMPLER_TYPE_DRY);
  local_a8 = COMMON_SAMPLER_TYPE_DRY;
  std::pair<const_char,_common_sampler_type>::pair<char,_common_sampler_type,_true>
            (&local_a0,&local_a1,&local_a8);
  this_00 = &local_98;
  local_a9 = common_sampler_type_to_chr(COMMON_SAMPLER_TYPE_TOP_K);
  local_b0 = COMMON_SAMPLER_TYPE_TOP_K;
  std::pair<const_char,_common_sampler_type>::pair<char,_common_sampler_type,_true>
            (this_00,&local_a9,&local_b0);
  this_01 = &local_90;
  local_b1 = common_sampler_type_to_chr(COMMON_SAMPLER_TYPE_TYPICAL_P);
  local_eb._M_h._M_single_bucket._3_4_ = 6;
  std::pair<const_char,_common_sampler_type>::pair<char,_common_sampler_type,_true>
            (this_01,&local_b1,(common_sampler_type *)((long)&local_eb._M_h._M_single_bucket + 3));
  this_02 = &local_88;
  local_eb._M_h._M_single_bucket._2_1_ = common_sampler_type_to_chr(COMMON_SAMPLER_TYPE_TOP_P);
  local_eb._M_h._M_rehash_policy._M_next_resize._3_4_ = 3;
  std::pair<const_char,_common_sampler_type>::pair<char,_common_sampler_type,_true>
            (this_02,(char *)((long)&local_eb._M_h._M_single_bucket + 2),
             (common_sampler_type *)((long)&local_eb._M_h._M_rehash_policy._M_next_resize + 3));
  local_eb._M_h._M_rehash_policy._M_next_resize._2_1_ =
       common_sampler_type_to_chr(COMMON_SAMPLER_TYPE_MIN_P);
  local_eb._M_h._M_rehash_policy._3_4_ = 4;
  std::pair<const_char,_common_sampler_type>::pair<char,_common_sampler_type,_true>
            (&local_80,(char *)((long)&local_eb._M_h._M_rehash_policy._M_next_resize + 2),
             (common_sampler_type *)((long)&local_eb._M_h._M_rehash_policy._M_max_load_factor + 3));
  this_03 = &local_78;
  local_eb._M_h._M_rehash_policy._M_max_load_factor._2_1_ =
       common_sampler_type_to_chr(COMMON_SAMPLER_TYPE_TEMPERATURE);
  local_eb._M_h._M_element_count._3_4_ = 7;
  std::pair<const_char,_common_sampler_type>::pair<char,_common_sampler_type,_true>
            (this_03,(char *)((long)&local_eb._M_h._M_rehash_policy._M_max_load_factor + 2),
             (common_sampler_type *)((long)&local_eb._M_h._M_element_count + 3));
  local_eb._M_h._M_element_count._2_1_ = common_sampler_type_to_chr(COMMON_SAMPLER_TYPE_XTC);
  local_eb._M_h._M_before_begin._M_nxt._3_4_ = 8;
  std::pair<const_char,_common_sampler_type>::pair<char,_common_sampler_type,_true>
            (&local_70,(char *)((long)&local_eb._M_h._M_element_count + 2),
             (common_sampler_type *)((long)&local_eb._M_h._M_before_begin._M_nxt + 3));
  local_eb._M_h._M_before_begin._M_nxt._2_1_ =
       common_sampler_type_to_chr(COMMON_SAMPLER_TYPE_INFILL);
  local_eb._M_h._M_bucket_count._3_4_ = 9;
  std::pair<const_char,_common_sampler_type>::pair<char,_common_sampler_type,_true>
            (&local_68,(char *)((long)&local_eb._M_h._M_before_begin._M_nxt + 2),
             (common_sampler_type *)((long)&local_eb._M_h._M_bucket_count + 3));
  local_eb._M_h._M_bucket_count._2_1_ = common_sampler_type_to_chr(COMMON_SAMPLER_TYPE_PENALTIES);
  local_eb._M_h._M_buckets._3_4_ = 10;
  std::pair<const_char,_common_sampler_type>::pair<char,_common_sampler_type,_true>
            (&local_60,(char *)((long)&local_eb._M_h._M_bucket_count + 2),
             (common_sampler_type *)((long)&local_eb._M_h._M_buckets + 3));
  local_50 = 9;
  this = &local_eb;
  local_58 = &local_a0;
  std::allocator<std::pair<const_char,_common_sampler_type>_>::allocator
            ((allocator<std::pair<const_char,_common_sampler_type>_> *)0x360ff5);
  __l._M_len = (size_type)this_02;
  __l._M_array = this_01;
  std::
  unordered_map<char,_common_sampler_type,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_common_sampler_type>_>_>
  ::unordered_map((unordered_map<char,_common_sampler_type,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_common_sampler_type>_>_>
                   *)this_00,__l,(size_type)__n,in_RDI,in_stack_fffffffffffffe68,
                  (allocator_type *)this_03);
  std::allocator<std::pair<const_char,_common_sampler_type>_>::~allocator
            ((allocator<std::pair<const_char,_common_sampler_type>_> *)0x361040);
  local_fd = 0;
  std::vector<common_sampler_type,_std::allocator<common_sampler_type>_>::vector
            ((vector<common_sampler_type,_std::allocator<common_sampler_type>_> *)0x361052);
  std::__cxx11::string::size();
  std::vector<common_sampler_type,_std::allocator<common_sampler_type>_>::reserve
            ((vector<common_sampler_type,_std::allocator<common_sampler_type>_> *)this_02,
             (size_type)this_01);
  local_108 = local_10;
  local_110._M_current = (char *)std::__cxx11::string::begin();
  local_118 = std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=
                           (in_stack_fffffffffffffe60,
                            (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)this), bVar1) {
    local_120 = __gnu_cxx::
                __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*(&local_110);
    __x._M_cur = (__node_type *)
                 std::
                 unordered_map<char,_common_sampler_type,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_common_sampler_type>_>_>
                 ::find(this,(key_type *)0x3610f0);
    local_128._M_cur = __x._M_cur;
    local_130._M_cur =
         (__node_type *)
         std::
         unordered_map<char,_common_sampler_type,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_common_sampler_type>_>_>
         ::end(this);
    bVar1 = std::__detail::operator!=(&local_128,&local_130);
    if (bVar1) {
      std::__detail::_Node_iterator<std::pair<const_char,_common_sampler_type>,_false,_false>::
      operator->((_Node_iterator<std::pair<const_char,_common_sampler_type>,_false,_false> *)
                 0x36113b);
      std::vector<common_sampler_type,_std::allocator<common_sampler_type>_>::push_back
                ((vector<common_sampler_type,_std::allocator<common_sampler_type>_> *)in_RDI,
                 (value_type *)__x._M_cur);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_110);
  }
  local_fd = 1;
  std::
  unordered_map<char,_common_sampler_type,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_common_sampler_type>_>_>
  ::~unordered_map((unordered_map<char,_common_sampler_type,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_common_sampler_type>_>_>
                    *)0x3611dd);
  return (vector<common_sampler_type,_std::allocator<common_sampler_type>_> *)__n;
}

Assistant:

std::vector<common_sampler_type> common_sampler_types_from_chars(const std::string & chars) {
    std::unordered_map<char, common_sampler_type> sampler_name_map = {
        { common_sampler_type_to_chr(COMMON_SAMPLER_TYPE_DRY),         COMMON_SAMPLER_TYPE_DRY },
        { common_sampler_type_to_chr(COMMON_SAMPLER_TYPE_TOP_K),       COMMON_SAMPLER_TYPE_TOP_K },
        { common_sampler_type_to_chr(COMMON_SAMPLER_TYPE_TYPICAL_P),   COMMON_SAMPLER_TYPE_TYPICAL_P },
        { common_sampler_type_to_chr(COMMON_SAMPLER_TYPE_TOP_P),       COMMON_SAMPLER_TYPE_TOP_P },
        { common_sampler_type_to_chr(COMMON_SAMPLER_TYPE_MIN_P),       COMMON_SAMPLER_TYPE_MIN_P },
        { common_sampler_type_to_chr(COMMON_SAMPLER_TYPE_TEMPERATURE), COMMON_SAMPLER_TYPE_TEMPERATURE },
        { common_sampler_type_to_chr(COMMON_SAMPLER_TYPE_XTC),         COMMON_SAMPLER_TYPE_XTC },
        { common_sampler_type_to_chr(COMMON_SAMPLER_TYPE_INFILL),      COMMON_SAMPLER_TYPE_INFILL },
        { common_sampler_type_to_chr(COMMON_SAMPLER_TYPE_PENALTIES),   COMMON_SAMPLER_TYPE_PENALTIES },
    };

    std::vector<common_sampler_type> samplers;
    samplers.reserve(chars.size());

    for (const auto & c : chars) {
        const auto sampler = sampler_name_map.find(c);
        if (sampler != sampler_name_map.end()) {
            samplers.push_back(sampler->second);
        }
    }

    return samplers;
}